

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O1

void __thiscall pbrt::MeasuredBRDF::MeasuredBRDF(MeasuredBRDF *this,Allocator alloc)

{
  (this->ndf).m_size.super_Tuple2<pbrt::Vector2,_int> = (Tuple2<pbrt::Vector2,_int>)0x0;
  (this->ndf).m_patch_size.super_Tuple2<pbrt::Vector2,_float> = (Tuple2<pbrt::Vector2,_float>)0x0;
  (this->ndf).m_inv_patch_size.super_Tuple2<pbrt::Vector2,_float> =
       (Tuple2<pbrt::Vector2,_float>)0x0;
  (this->ndf).m_param_values.alloc.memoryResource = alloc.memoryResource;
  (this->ndf).m_param_values.ptr = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)0x0;
  (this->ndf).m_param_values.nAlloc = 0;
  (this->ndf).m_param_values.nStored = 0;
  (this->ndf).m_data.alloc.memoryResource = alloc.memoryResource;
  (this->ndf).m_data.ptr = (float *)0x0;
  (this->ndf).m_data.nAlloc = 0;
  (this->ndf).m_data.nStored = 0;
  (this->ndf).m_marginal_cdf.alloc.memoryResource = alloc.memoryResource;
  (this->ndf).m_marginal_cdf.ptr = (float *)0x0;
  (this->ndf).m_marginal_cdf.nAlloc = 0;
  (this->ndf).m_marginal_cdf.nStored = 0;
  (this->ndf).m_conditional_cdf.alloc.memoryResource = alloc.memoryResource;
  (this->ndf).m_conditional_cdf.ptr = (float *)0x0;
  (this->ndf).m_conditional_cdf.nAlloc = 0;
  (this->ndf).m_conditional_cdf.nStored = 0;
  (this->sigma).m_size.super_Tuple2<pbrt::Vector2,_int> = (Tuple2<pbrt::Vector2,_int>)0x0;
  (this->ndf).m_conditional_cdf.nStored = 0;
  (this->sigma).m_size.super_Tuple2<pbrt::Vector2,_int> = (Tuple2<pbrt::Vector2,_int>)0x0;
  (this->sigma).m_patch_size.super_Tuple2<pbrt::Vector2,_float> = (Tuple2<pbrt::Vector2,_float>)0x0;
  (this->sigma).m_inv_patch_size.super_Tuple2<pbrt::Vector2,_float> =
       (Tuple2<pbrt::Vector2,_float>)0x0;
  (this->sigma).m_param_values.alloc.memoryResource = alloc.memoryResource;
  (this->sigma).m_param_values.ptr = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)0x0;
  (this->sigma).m_param_values.nAlloc = 0;
  (this->sigma).m_param_values.nStored = 0;
  (this->sigma).m_data.alloc.memoryResource = alloc.memoryResource;
  (this->sigma).m_data.nStored = 0;
  (this->sigma).m_data.ptr = (float *)0x0;
  (this->sigma).m_data.nAlloc = 0;
  (this->sigma).m_marginal_cdf.alloc.memoryResource = alloc.memoryResource;
  (this->sigma).m_marginal_cdf.nStored = 0;
  (this->sigma).m_marginal_cdf.ptr = (float *)0x0;
  (this->sigma).m_marginal_cdf.nAlloc = 0;
  (this->sigma).m_conditional_cdf.alloc.memoryResource = alloc.memoryResource;
  (this->sigma).m_conditional_cdf.nStored = 0;
  (this->sigma).m_conditional_cdf.ptr = (float *)0x0;
  (this->sigma).m_conditional_cdf.nAlloc = 0;
  PiecewiseLinear2D<2UL>::PiecewiseLinear2D(&this->vndf,alloc);
  PiecewiseLinear2D<2UL>::PiecewiseLinear2D(&this->luminance,alloc);
  PiecewiseLinear2D<3UL>::PiecewiseLinear2D(&this->spectra,alloc);
  (this->wavelengths).alloc.memoryResource = alloc.memoryResource;
  (this->wavelengths).ptr = (float *)0x0;
  (this->wavelengths).nAlloc = 0;
  (this->wavelengths).nStored = 0;
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  (this->filename)._M_string_length = 0;
  (this->filename).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

MeasuredBRDF(Allocator alloc)
        : ndf(alloc),
          sigma(alloc),
          vndf(alloc),
          luminance(alloc),
          spectra(alloc),
          wavelengths(alloc) {}